

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigTable.c
# Opt level: O2

Aig_Obj_t * Aig_TableLookup(Aig_Man_t *p,Aig_Obj_t *pGhost)

{
  Aig_Obj_t *pAVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t **ppAVar3;
  unsigned_long uVar4;
  Aig_Obj_t *pAVar5;
  uint uVar6;
  char *__assertion;
  
  if (((ulong)pGhost & 1) == 0) {
    uVar6 = *(uint *)&pGhost->field_0x18 & 7;
    if (uVar6 - 7 < 0xfffffffe) {
      __assertion = "Aig_ObjIsNode(pGhost)";
      uVar6 = 0x78;
    }
    else {
      pAVar1 = pGhost->pFanin0;
      if ((pAVar1 == (Aig_Obj_t *)0x0) || (pAVar2 = pGhost->pFanin1, pAVar2 == (Aig_Obj_t *)0x0)) {
        __assertion = "Aig_ObjChild0(pGhost) && Aig_ObjChild1(pGhost)";
        uVar6 = 0x79;
      }
      else {
        if (*(int *)(((ulong)pAVar1 & 0xfffffffffffffffe) + 0x24) <
            *(int *)(((ulong)pAVar2 & 0xfffffffffffffffe) + 0x24)) {
          ppAVar3 = p->pTable;
          if (((ppAVar3 == (Aig_Obj_t **)0x0) ||
              ((*(uint *)(((ulong)pAVar1 & 0xfffffffffffffffe) + 0x18) & 0xffffffc0) == 0)) ||
             ((*(uint *)(((ulong)pAVar2 & 0xfffffffffffffffe) + 0x18) & 0xffffffc0) == 0)) {
LAB_00586a83:
            pAVar5 = (Aig_Obj_t *)0x0;
          }
          else {
            uVar4 = Aig_Hash(pGhost,p->nTableSize);
            pAVar5 = (Aig_Obj_t *)(ppAVar3 + uVar4);
            do {
              pAVar5 = (pAVar5->field_0).pNext;
              if (pAVar5 == (Aig_Obj_t *)0x0) goto LAB_00586a83;
            } while (((pAVar5->pFanin0 != pAVar1) || (pAVar5->pFanin1 != pAVar2)) ||
                    ((*(uint *)&pAVar5->field_0x18 & 7) != uVar6));
          }
          return pAVar5;
        }
        __assertion = "Aig_ObjFanin0(pGhost)->Id < Aig_ObjFanin1(pGhost)->Id";
        uVar6 = 0x7a;
      }
    }
  }
  else {
    __assertion = "!Aig_IsComplement(pGhost)";
    uVar6 = 0x77;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigTable.c"
                ,uVar6,"Aig_Obj_t *Aig_TableLookup(Aig_Man_t *, Aig_Obj_t *)");
}

Assistant:

Aig_Obj_t * Aig_TableLookup( Aig_Man_t * p, Aig_Obj_t * pGhost )
{
    Aig_Obj_t * pEntry;
    assert( !Aig_IsComplement(pGhost) );
    assert( Aig_ObjIsNode(pGhost) );
    assert( Aig_ObjChild0(pGhost) && Aig_ObjChild1(pGhost) );
    assert( Aig_ObjFanin0(pGhost)->Id < Aig_ObjFanin1(pGhost)->Id );
    if ( p->pTable == NULL || !Aig_ObjRefs(Aig_ObjFanin0(pGhost)) || !Aig_ObjRefs(Aig_ObjFanin1(pGhost)) )
        return NULL;
    for ( pEntry = p->pTable[Aig_Hash(pGhost, p->nTableSize)]; pEntry; pEntry = pEntry->pNext )
    {
        if ( Aig_ObjChild0(pEntry) == Aig_ObjChild0(pGhost) && 
             Aig_ObjChild1(pEntry) == Aig_ObjChild1(pGhost) && 
             Aig_ObjType(pEntry) == Aig_ObjType(pGhost) )
            return pEntry;
    }
    return NULL;
}